

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFuzzyImageCompare.cpp
# Opt level: O2

float tcu::fuzzyCompare(FuzzyCompareParams *params,ConstPixelBufferAccess *ref,
                       ConstPixelBufferAccess *cmp,PixelBufferAccess *errorMask)

{
  int width;
  int height;
  ChannelOrder CVar1;
  deUint32 dVar2;
  uint uVar3;
  int iVar4;
  int x;
  InternalError *this;
  ulong uVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ConstPixelBufferAccess refAccess;
  vector<float,_std::allocator<float>_> kernel;
  ConstPixelBufferAccess local_e0;
  TextureLevel cmpFiltered;
  ConstPixelBufferAccess cmpAccess;
  TextureLevel refFiltered;
  Random rnd;
  
  if (((((ref->m_format).type == UNORM_INT8) && ((ref->m_format).order - RGB < 2)) &&
      ((cmp->m_format).type == UNORM_INT8)) && ((cmp->m_format).order - RGB < 2)) {
    width = (ref->m_size).m_data[0];
    height = (ref->m_size).m_data[1];
    deRandom_init(&rnd.m_rnd,0x29b);
    cmpFiltered.m_format.order = RGBA;
    cmpFiltered.m_format.type = UNORM_INT8;
    TextureLevel::TextureLevel(&refFiltered,&cmpFiltered.m_format,width,height,1);
    refAccess.m_format.order = RGBA;
    refAccess.m_format.type = UNORM_INT8;
    TextureLevel::TextureLevel(&cmpFiltered,&refAccess.m_format,width,height,1);
    std::vector<float,_std::allocator<float>_>::vector(&kernel,3,(allocator_type *)&refAccess);
    kernel.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = 0.1;
    kernel.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[0] = 0.1;
    kernel.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = 0.8;
    iVar6 = ((int)((ulong)((long)kernel.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)kernel.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2) + -1) / 2;
    CVar1 = (ref->m_format).order;
    if (CVar1 == RGB) {
      PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&refAccess,&refFiltered);
      separableConvolve<4,3>((PixelBufferAccess *)&refAccess,ref,iVar6,iVar6,&kernel,&kernel);
    }
    else if (CVar1 == RGBA) {
      PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&refAccess,&refFiltered);
      separableConvolve<4,4>((PixelBufferAccess *)&refAccess,ref,iVar6,iVar6,&kernel,&kernel);
    }
    CVar1 = (cmp->m_format).order;
    if (CVar1 == RGB) {
      PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&refAccess,&cmpFiltered);
      separableConvolve<4,3>((PixelBufferAccess *)&refAccess,cmp,iVar6,iVar6,&kernel,&kernel);
    }
    else if (CVar1 == RGBA) {
      PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&refAccess,&cmpFiltered);
      separableConvolve<4,4>((PixelBufferAccess *)&refAccess,cmp,iVar6,iVar6,&kernel,&kernel);
    }
    refAccess.m_format.order = R;
    refAccess.m_format.type = 0x3f800000;
    refAccess.m_size.m_data[0] = 0;
    refAccess.m_size.m_data[1] = 0x3f800000;
    clear(errorMask,(Vec4 *)&refAccess);
    TextureLevel::getAccess((PixelBufferAccess *)&cmpAccess,&refFiltered);
    ConstPixelBufferAccess::ConstPixelBufferAccess(&refAccess,&cmpAccess);
    TextureLevel::getAccess((PixelBufferAccess *)&local_e0,&cmpFiltered);
    ConstPixelBufferAccess::ConstPixelBufferAccess(&cmpAccess,&local_e0);
    uVar5 = 0;
    iVar7 = 0;
    for (iVar6 = 1; iVar6 < height + -1; iVar6 = iVar6 + 1) {
      for (x = 1; x < width + -1; x = iVar4 + x) {
        dVar2 = distSquaredToNeighbor<4>
                          (&rnd,*(deUint32 *)
                                 ((long)refAccess.m_data +
                                 (long)(x * 4) + (long)(refAccess.m_pitch.m_data[1] * iVar6)),
                           &cmpAccess,x,iVar6);
        uVar3 = distSquaredToNeighbor<4>
                          (&rnd,*(deUint32 *)
                                 ((long)cmpAccess.m_data +
                                 (long)(x * 4) + (long)(cmpAccess.m_pitch.m_data[1] * iVar6)),
                           &refAccess,x,iVar6);
        if (dVar2 < uVar3) {
          uVar3 = dVar2;
        }
        bVar8 = CARRY8(uVar5,(ulong)(uVar3 * uVar3));
        uVar5 = uVar5 + uVar3 * uVar3;
        if (bVar8) {
          uVar5 = 0xffffffffffffffff;
        }
        ConstPixelBufferAccess::getPixel(&local_e0,(int)cmp,x,iVar6);
        local_e0.m_format.type =
             (ChannelType)
             (((float)local_e0.m_size.m_data[0] * 0.0722 +
              (float)local_e0.m_format.order * 0.2126 + (float)local_e0.m_format.type * 0.7152) *
              0.3 + 0.7);
        fVar9 = ((float)uVar3 / 63001.0) * ((float)uVar3 / 63001.0) * 500.0;
        local_e0.m_format.order = (ChannelOrder)((float)local_e0.m_format.type * fVar9);
        local_e0.m_format.type = (ChannelType)((float)local_e0.m_format.type * (1.0 - fVar9));
        local_e0.m_size.m_data[0] = 0;
        local_e0.m_size.m_data[1] = 0x3f800000;
        PixelBufferAccess::setPixel(errorMask,(Vec4 *)&local_e0,x,iVar6,0);
        iVar4 = 1;
        if (0 < params->maxSampleSkip) {
          iVar4 = de::Random::getInt(&rnd,0,params->maxSampleSkip);
        }
        iVar7 = iVar7 + 1;
      }
    }
    auVar10._8_4_ = (int)(uVar5 >> 0x20);
    auVar10._0_8_ = uVar5;
    auVar10._12_4_ = 0x45300000;
    auVar11._0_8_ =
         (auVar10._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0);
    auVar11._8_8_ = (double)((height + -2) * (width + -2));
    auVar12._8_4_ = SUB84((double)iVar7,0);
    auVar12._0_8_ = 0x41ed9281ce200000;
    auVar12._12_4_ = (int)((ulong)(double)iVar7 >> 0x20);
    auVar12 = divpd(auVar11,auVar12);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&kernel.super__Vector_base<float,_std::allocator<float>_>);
    TextureLevel::~TextureLevel(&cmpFiltered);
    TextureLevel::~TextureLevel(&refFiltered);
    return (float)(auVar12._8_8_ * auVar12._0_8_);
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  InternalError::InternalError
            (this,"Unsupported format in fuzzy comparison",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuFuzzyImageCompare.cpp"
             ,0x117);
  __cxa_throw(this,&InternalError::typeinfo,Exception::~Exception);
}

Assistant:

float fuzzyCompare (const FuzzyCompareParams& params, const ConstPixelBufferAccess& ref, const ConstPixelBufferAccess& cmp, const PixelBufferAccess& errorMask)
{
	DE_ASSERT(ref.getWidth() == cmp.getWidth() && ref.getHeight() == cmp.getHeight());
	DE_ASSERT(errorMask.getWidth() == ref.getWidth() && errorMask.getHeight() == ref.getHeight());

	if (!isFormatSupported(ref.getFormat()) || !isFormatSupported(cmp.getFormat()))
		throw InternalError("Unsupported format in fuzzy comparison", DE_NULL, __FILE__, __LINE__);

	int			width	= ref.getWidth();
	int			height	= ref.getHeight();
	de::Random	rnd		(667);

	// Filtered
	TextureLevel refFiltered(TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8), width, height);
	TextureLevel cmpFiltered(TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8), width, height);

	// Kernel = {0.1, 0.8, 0.1}
	vector<float> kernel(3);
	kernel[0] = kernel[2] = 0.1f; kernel[1]= 0.8f;
	int shift = (int)(kernel.size() - 1) / 2;

	switch (ref.getFormat().order)
	{
		case TextureFormat::RGBA:	separableConvolve<4, 4>(refFiltered, ref, shift, shift, kernel, kernel);	break;
		case TextureFormat::RGB:	separableConvolve<4, 3>(refFiltered, ref, shift, shift, kernel, kernel);	break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	switch (cmp.getFormat().order)
	{
		case TextureFormat::RGBA:	separableConvolve<4, 4>(cmpFiltered, cmp, shift, shift, kernel, kernel);	break;
		case TextureFormat::RGB:	separableConvolve<4, 3>(cmpFiltered, cmp, shift, shift, kernel, kernel);	break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	int			numSamples	= 0;
	deUint64	distSum4	= 0ull;

	// Clear error mask to green.
	clear(errorMask, Vec4(0.0f, 1.0f, 0.0f, 1.0f));

	ConstPixelBufferAccess refAccess = refFiltered.getAccess();
	ConstPixelBufferAccess cmpAccess = cmpFiltered.getAccess();

	for (int y = 1; y < height-1; y++)
	{
		for (int x = 1; x < width-1; x += params.maxSampleSkip > 0 ? (int)rnd.getInt(0, params.maxSampleSkip) : 1)
		{
			const deUint32	minDist2RefToCmp	= distSquaredToNeighbor<4>(rnd, readUnorm8<4>(refAccess, x, y), cmpAccess, x, y);
			const deUint32	minDist2CmpToRef	= distSquaredToNeighbor<4>(rnd, readUnorm8<4>(cmpAccess, x, y), refAccess, x, y);
			const deUint32	minDist2			= de::min(minDist2RefToCmp, minDist2CmpToRef);
			const deUint64	newSum4				= distSum4 + minDist2*minDist2;

			distSum4	 = (newSum4 >= distSum4) ? newSum4 : ~0ull; // In case of overflow
			numSamples	+= 1;

			// Build error image.
			{
				const int	scale	= 255-MIN_ERR_THRESHOLD;
				const float	err2	= float(minDist2) / float(scale*scale);
				const float	err4	= err2*err2;
				const float	red		= err4 * 500.0f;
				const float	luma	= toGrayscale(cmp.getPixel(x, y));
				const float	rF		= 0.7f + 0.3f*luma;

				errorMask.setPixel(Vec4(red*rF, (1.0f-red)*rF, 0.0f, 1.0f), x, y);
			}
		}
	}

	{
		// Scale error sum based on number of samples taken
		const double	pSamples	= double((width-2) * (height-2)) / double(numSamples);
		const deUint64	colScale	= deUint64(255-MIN_ERR_THRESHOLD);
		const deUint64	colScale4	= colScale*colScale*colScale*colScale;

		return float(double(distSum4) / double(colScale4) * pSamples);
	}
}